

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O1

int Lpk_Resynthesize(Abc_Ntk_t *pNtk,Lpk_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  Lpk_Man_t *p;
  Vec_Vec_t *pVVar8;
  void **ppvVar9;
  undefined8 *puVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  ProgressBar *local_70;
  int local_64;
  ulong local_58;
  timespec ts;
  
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                  ,0x202,"int Lpk_Resynthesize(Abc_Ntk_t *, Lpk_Par_t *)");
  }
  Abc_NtkSweep(pNtk,0);
  pvVar7 = Abc_FrameReadLibLut();
  if (pvVar7 == (void *)0x0) {
    iVar5 = Abc_NtkGetFaninMax(pNtk);
  }
  else {
    pvVar7 = Abc_FrameReadLibLut();
    iVar5 = *(int *)((long)pvVar7 + 8);
  }
  pPars->nLutSize = iVar5;
  if (6 < iVar5) {
    pPars->nLutSize = 6;
  }
  if (pPars->nLutSize < 3) {
    pPars->nLutSize = 3;
  }
  uVar2 = pPars->nLutSize;
  if ((int)(uVar2 - 2) < pPars->nVarsShared) {
    pPars->nVarsShared = uVar2 - 2;
  }
  iVar5 = pPars->nLutsMax * (uVar2 - 1);
  if (0xf < iVar5) {
    iVar6 = pPars->nLutsMax;
    iVar5 = uVar2 + (iVar6 + -1) * (uVar2 - 1) + -1;
    do {
      iVar5 = iVar5 + (1 - uVar2);
      iVar6 = iVar6 + -1;
    } while (0xf < iVar5);
    pPars->nLutsMax = iVar6;
  }
  pPars->nVarsMax = iVar5 + 1;
  if (pPars->fVerbose != 0) {
    printf("Resynthesis for %d %d-LUTs with %d non-MFFC LUTs, %d crossbars, and %d-input cuts.\n",
           (ulong)(uint)pPars->nLutsMax,(ulong)uVar2,(ulong)(uint)pPars->nLutsOver,
           (ulong)(uint)pPars->nVarsShared);
  }
  iVar5 = Abc_NtkToAig(pNtk);
  if (iVar5 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    return 0;
  }
  if (pNtk->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                  ,0x228,"int Lpk_Resynthesize(Abc_Ntk_t *, Lpk_Par_t *)");
  }
  Abc_NtkLevel(pNtk);
  Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
  p = Lpk_ManStart(pPars);
  p->pNtk = pNtk;
  p->nNodesTotal = pNtk->nObjCounts[7];
  uVar2 = pNtk->LevelMax;
  pVVar8 = (Vec_Vec_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar2 - 1) {
    uVar12 = uVar2;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = uVar12;
  if (uVar12 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)(int)uVar12 << 3);
  }
  pVVar8->pArray = ppvVar9;
  if (0 < (int)uVar2) {
    uVar14 = 0;
    do {
      puVar10 = (undefined8 *)malloc(0x10);
      *puVar10 = 0;
      puVar10[1] = 0;
      ppvVar9[uVar14] = puVar10;
      uVar14 = uVar14 + 1;
    } while (uVar2 != uVar14);
  }
  pVVar8->nSize = uVar2;
  p->vLevels = pVVar8;
  if (p->pPars->fSatur != 0) {
    pVVar8 = (Vec_Vec_t *)malloc(0x10);
    pVVar8->nCap = 0;
    pVVar8->nSize = 0;
    pVVar8->pArray = (void **)0x0;
    p->vVisited = pVVar8;
  }
  if (pPars->fVerbose != 0) {
    iVar5 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNets = iVar5;
    p->nTotalNodes = pNtk->nObjCounts[7];
  }
  local_58 = 1;
  local_70 = (ProgressBar *)0x0;
  local_64 = p->nNodesTotal;
  do {
    if (p->pPars->fSatur != 0) {
      pVVar8 = p->vVisited;
      iVar6 = pNtk->vObjs->nSize;
      iVar5 = iVar6 + 1;
      if (pVVar8->nSize <= iVar5) {
        iVar1 = iVar6 + 2;
        if (pVVar8->nCap <= iVar5) {
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((long)iVar1 << 3);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar8->pArray,(long)iVar1 << 3);
          }
          pVVar8->pArray = ppvVar9;
          pVVar8->nCap = iVar1;
        }
        iVar3 = pVVar8->nSize;
        lVar15 = (long)iVar3;
        if (iVar3 <= iVar5) {
          iVar5 = (iVar6 - iVar3) + 2;
          do {
            puVar10 = (undefined8 *)malloc(0x10);
            *puVar10 = 0;
            puVar10[1] = 0;
            pVVar8->pArray[lVar15] = puVar10;
            lVar15 = lVar15 + 1;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        pVVar8->nSize = iVar1;
      }
    }
    iVar5 = pNtk->vObjs->nSize;
    if (pPars->fVeryVerbose == 0) {
      local_70 = Extra_ProgressBarStart((FILE *)_stdout,iVar5);
    }
    pVVar11 = pNtk->vObjs;
    if (0 < pVVar11->nSize) {
      lVar15 = 0;
      do {
        pAVar4 = (Abc_Obj_t *)pVVar11->pArray[lVar15];
        if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
           ((pPars->fFirst == 0 ||
            (0xfffffffd <
             (*(uint *)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray] + 0x14) & 0xf)
             - 5)))) {
          if (iVar5 <= lVar15) break;
          if ((pPars->fVeryVerbose == 0) &&
             ((local_70 == (ProgressBar *)0x0 || (local_70->nItemsNext <= lVar15)))) {
            Extra_ProgressBarUpdate_int(local_70,(int)lVar15,(char *)0x0);
          }
          if ((p->pPars->fSatur == 0) || (iVar6 = Lpk_NodeHasChanged(p,pAVar4->Id), iVar6 != 0)) {
            p->pObj = pAVar4;
            if (p->pPars->fOldAlgo == 0) {
              Lpk_ResynthesizeNodeNew(p);
            }
            else {
              Lpk_ResynthesizeNode(p);
            }
          }
        }
        lVar15 = lVar15 + 1;
        pVVar11 = pNtk->vObjs;
      } while (lVar15 < pVVar11->nSize);
    }
    if (pPars->fVeryVerbose == 0) {
      Extra_ProgressBarStop(local_70);
    }
    if (((((double)(local_64 - pNtk->nObjCounts[7]) * 100.0) / (double)p->nNodesTotal < 0.05) ||
        (p->pPars->fSatur == 0)) || (pPars->fFirst != 0)) {
      Abc_NtkStopReverseLevels(pNtk);
      if (pPars->fVerbose != 0) {
        iVar5 = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNets2 = iVar5;
        iVar5 = pNtk->nObjCounts[7];
        p->nTotalNodes2 = iVar5;
        printf("Node gain = %5d. (%.2f %%)  ",
               SUB84(((double)(p->nTotalNodes - iVar5) * 100.0) / (double)p->nTotalNodes,0));
        printf("Edge gain = %5d. (%.2f %%)  ",
               SUB84(((double)(p->nTotalNets - p->nTotalNets2) * 100.0) / (double)p->nTotalNets,0));
        printf("Muxes = %4d. Dsds = %4d.",(ulong)(uint)p->nMuxes,(ulong)(uint)p->nDsds);
        putchar(10);
        printf("Nodes = %5d (%3d)  Cuts = %5d (%4d)  Changes = %5d  Iter = %2d  Benefit = %d.\n",
               (ulong)(uint)p->nNodesTotal,(ulong)(uint)p->nNodesOver,(ulong)(uint)p->nCutsTotal,
               (ulong)(uint)p->nCutsUseful,(ulong)(uint)p->nChanges,local_58,
               (ulong)(uint)p->nBenefited);
        printf("Non-DSD:");
        if (2 < pPars->nVarsMax) {
          lVar15 = 0x6d34;
          do {
            if (p->pCuts[0].uSign[lVar15 + -0xb] != 0) {
              printf(" %d=%d",(ulong)((int)lVar15 - 0x6d31));
            }
            lVar16 = lVar15 + -0x6d31;
            lVar15 = lVar15 + 1;
          } while (lVar16 < pPars->nVarsMax);
        }
        putchar(10);
        iVar6 = 3;
        iVar5 = clock_gettime(3,(timespec *)&ts);
        if (iVar5 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        p->timeTotal = lVar15 + lVar13;
        lVar16 = p->timeEval;
        p->timeEval = lVar16 - p->timeMap;
        p->timeOther = (lVar15 + lVar13) - (lVar16 + p->timeCuts + p->timeTruth);
        Abc_Print(iVar6,"%s =","Cuts  ");
        dVar17 = 0.0;
        if (p->timeTotal != 0) {
          dVar17 = ((double)p->timeCuts * 100.0) / (double)p->timeTotal;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeCuts / 1000000.0,0),dVar17);
        Abc_Print(iVar6,"%s =","Truth ");
        dVar17 = 0.0;
        if (p->timeTotal != 0) {
          dVar17 = ((double)p->timeTruth * 100.0) / (double)p->timeTotal;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeTruth / 1000000.0,0),dVar17);
        Abc_Print(iVar6,"%s =","CSupps");
        dVar17 = 0.0;
        if (p->timeTotal != 0) {
          dVar17 = ((double)p->timeSupps * 100.0) / (double)p->timeTotal;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeSupps / 1000000.0,0),dVar17);
        Abc_Print(iVar6,"%s =","Eval  ");
        dVar17 = 0.0;
        if (p->timeTotal != 0) {
          dVar17 = ((double)p->timeEval * 100.0) / (double)p->timeTotal;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeEval / 1000000.0,0),dVar17);
        Abc_Print(iVar6,"%s ="," MuxAn");
        dVar17 = 0.0;
        if (p->timeEval != 0) {
          dVar17 = ((double)p->timeEvalMuxAn * 100.0) / (double)p->timeEval;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeEvalMuxAn / 1000000.0,0),
                  dVar17);
        Abc_Print(iVar6,"%s ="," MuxSp");
        dVar17 = 0.0;
        if (p->timeEval != 0) {
          dVar17 = ((double)p->timeEvalMuxSp * 100.0) / (double)p->timeEval;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeEvalMuxSp / 1000000.0,0),
                  dVar17);
        Abc_Print(iVar6,"%s ="," DsdAn");
        dVar17 = 0.0;
        if (p->timeEval != 0) {
          dVar17 = ((double)p->timeEvalDsdAn * 100.0) / (double)p->timeEval;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeEvalDsdAn / 1000000.0,0),
                  dVar17);
        Abc_Print(iVar6,"%s ="," DsdSp");
        dVar17 = 0.0;
        if (p->timeEval != 0) {
          dVar17 = ((double)p->timeEvalDsdSp * 100.0) / (double)p->timeEval;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeEvalDsdSp / 1000000.0,0),
                  dVar17);
        Abc_Print(iVar6,"%s ="," Other");
        lVar13 = p->timeEval;
        dVar18 = (double)(lVar13 - (p->timeEvalMuxAn + p->timeEvalMuxSp + p->timeEvalDsdAn +
                                   p->timeEvalDsdSp));
        dVar17 = 0.0;
        if (lVar13 != 0) {
          dVar17 = (dVar18 * 100.0) / (double)lVar13;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84(dVar18 / 1000000.0,0),dVar17);
        Abc_Print(iVar6,"%s =","Map   ");
        dVar17 = 0.0;
        if (p->timeTotal != 0) {
          dVar17 = ((double)p->timeMap * 100.0) / (double)p->timeTotal;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeMap / 1000000.0,0),dVar17);
        Abc_Print(iVar6,"%s =","Other ");
        dVar17 = 0.0;
        if (p->timeTotal != 0) {
          dVar17 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)p->timeOther / 1000000.0,0),dVar17);
        Abc_Print(iVar6,"%s =","TOTAL ");
        dVar17 = (double)p->timeTotal;
        dVar18 = 0.0;
        if (p->timeTotal != 0) {
          dVar18 = (dVar17 * 100.0) / dVar17;
        }
        Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84(dVar17 / 1000000.0,0),dVar18);
      }
      Lpk_ManStop(p);
      iVar5 = Abc_NtkCheck(pNtk);
      if (iVar5 == 0) {
        puts("Lpk_Resynthesize: The network check has failed.");
        return 0;
      }
      return 1;
    }
    local_58 = (ulong)((int)local_58 + 1);
    local_64 = pNtk->nObjCounts[7];
  } while( true );
}

Assistant:

int Lpk_Resynthesize( Abc_Ntk_t * pNtk, Lpk_Par_t * pPars )
{
    ProgressBar * pProgress = NULL; // Suppress "might be used uninitialized"
    Lpk_Man_t * p;
    Abc_Obj_t * pObj;
    double Delta;
//    int * pnFanouts, nObjMax;
    int i, Iter, nNodes, nNodesPrev;
    abctime clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
 
    // sweep dangling nodes as a preprocessing step
    Abc_NtkSweep( pNtk, 0 );

    // get the number of inputs
    if ( Abc_FrameReadLibLut() )
        pPars->nLutSize = ((If_LibLut_t *)Abc_FrameReadLibLut())->LutMax;
    else
        pPars->nLutSize = Abc_NtkGetFaninMax( pNtk );
    if ( pPars->nLutSize > 6 )
        pPars->nLutSize = 6;
    if ( pPars->nLutSize < 3 )
        pPars->nLutSize = 3;
    // adjust the number of crossbars based on LUT size
    if ( pPars->nVarsShared > pPars->nLutSize - 2 )
        pPars->nVarsShared = pPars->nLutSize - 2;
    // get the max number of LUTs tried
    pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize - 1) + 1; // V = N * (K-1) + 1
    while ( pPars->nVarsMax > 16 )
    {
        pPars->nLutsMax--;
        pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize - 1) + 1;

    }
    if ( pPars->fVerbose )
    {
        printf( "Resynthesis for %d %d-LUTs with %d non-MFFC LUTs, %d crossbars, and %d-input cuts.\n",
            pPars->nLutsMax, pPars->nLutSize, pPars->nLutsOver, pPars->nVarsShared, pPars->nVarsMax );
    }
 

    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // set the number of levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // start the manager
    p = Lpk_ManStart( pPars );
    p->pNtk = pNtk;
    p->nNodesTotal = Abc_NtkNodeNum(pNtk);
    p->vLevels = Vec_VecStart( pNtk->LevelMax ); 
    if ( p->pPars->fSatur )
        p->vVisited = Vec_VecStart( 0 );
    if ( pPars->fVerbose )
    {
        p->nTotalNets = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNodes = Abc_NtkNodeNum(pNtk);
    }
/*
    // save the number of fanouts of all objects
    nObjMax = Abc_NtkObjNumMax( pNtk );
    pnFanouts = ABC_ALLOC( int, nObjMax );
    memset( pnFanouts, 0, sizeof(int) * nObjMax );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pnFanouts[pObj->Id] = Abc_ObjFanoutNum(pObj);
*/

    // iterate over the network
    nNodesPrev = p->nNodesTotal;
    for ( Iter = 1; ; Iter++ )
    {
        // expand storage for changed nodes
        if ( p->pPars->fSatur )
            Vec_VecExpand( p->vVisited, Abc_NtkObjNumMax(pNtk) + 1 );

        // consider all nodes
        nNodes = Abc_NtkObjNumMax(pNtk);
        if ( !pPars->fVeryVerbose )
            pProgress = Extra_ProgressBarStart( stdout, nNodes );
        Abc_NtkForEachNode( pNtk, pObj, i )
        {
            // skip all except the final node
            if ( pPars->fFirst )
            {
                if ( !Abc_ObjIsCo(Abc_ObjFanout0(pObj)) )
                    continue;
            }
            if ( i >= nNodes )
                break;
            if ( !pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, i, NULL );
            // skip the nodes that did not change
            if ( p->pPars->fSatur && !Lpk_NodeHasChanged(p, pObj->Id) )
                continue;
            // resynthesize
            p->pObj = pObj;
            if ( p->pPars->fOldAlgo )
                Lpk_ResynthesizeNode( p );
            else
                Lpk_ResynthesizeNodeNew( p );
        }
        if ( !pPars->fVeryVerbose )
            Extra_ProgressBarStop( pProgress );

        // check the increase
        Delta = 100.00 * (nNodesPrev - Abc_NtkNodeNum(pNtk)) / p->nNodesTotal;
        if ( Delta < 0.05 )
            break;
        nNodesPrev = Abc_NtkNodeNum(pNtk);
        if ( !p->pPars->fSatur )
            break;

        if ( pPars->fFirst )
            break;
    }
    Abc_NtkStopReverseLevels( pNtk );
/*
    // report the fanout changes
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( i >= nObjMax )
            continue;
        if ( Abc_ObjFanoutNum(pObj) - pnFanouts[pObj->Id] == 0 )
            continue;
        printf( "%d ", Abc_ObjFanoutNum(pObj) - pnFanouts[pObj->Id] );
    }
    printf( "\n" );
*/

    if ( pPars->fVerbose )
    {
//        Cloud_PrintInfo( p->pDsdMan->dd );
        p->nTotalNets2 = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNodes2 = Abc_NtkNodeNum(pNtk);
        printf( "Node gain = %5d. (%.2f %%)  ", 
            p->nTotalNodes-p->nTotalNodes2, 100.0*(p->nTotalNodes-p->nTotalNodes2)/p->nTotalNodes );
        printf( "Edge gain = %5d. (%.2f %%)  ", 
            p->nTotalNets-p->nTotalNets2, 100.0*(p->nTotalNets-p->nTotalNets2)/p->nTotalNets );
        printf( "Muxes = %4d. Dsds = %4d.", p->nMuxes, p->nDsds );
        printf( "\n" );
        printf( "Nodes = %5d (%3d)  Cuts = %5d (%4d)  Changes = %5d  Iter = %2d  Benefit = %d.\n", 
            p->nNodesTotal, p->nNodesOver, p->nCutsTotal, p->nCutsUseful, p->nChanges, Iter, p->nBenefited );

        printf( "Non-DSD:" );
        for ( i = 3; i <= pPars->nVarsMax; i++ )
            if ( p->nBlocks[i] )
                printf( " %d=%d", i, p->nBlocks[i] );
        printf( "\n" );

        p->timeTotal = Abc_Clock() - clk;
        p->timeEval  = p->timeEval  - p->timeMap;
        p->timeOther = p->timeTotal - p->timeCuts - p->timeTruth - p->timeEval - p->timeMap;
        ABC_PRTP( "Cuts  ", p->timeCuts,  p->timeTotal );
        ABC_PRTP( "Truth ", p->timeTruth, p->timeTotal );
        ABC_PRTP( "CSupps", p->timeSupps, p->timeTotal );
        ABC_PRTP( "Eval  ", p->timeEval,  p->timeTotal );
        ABC_PRTP( " MuxAn", p->timeEvalMuxAn, p->timeEval );
        ABC_PRTP( " MuxSp", p->timeEvalMuxSp, p->timeEval );
        ABC_PRTP( " DsdAn", p->timeEvalDsdAn, p->timeEval );
        ABC_PRTP( " DsdSp", p->timeEvalDsdSp, p->timeEval );
        ABC_PRTP( " Other", p->timeEval-p->timeEvalMuxAn-p->timeEvalMuxSp-p->timeEvalDsdAn-p->timeEvalDsdSp, p->timeEval );
        ABC_PRTP( "Map   ", p->timeMap,   p->timeTotal );
        ABC_PRTP( "Other ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL ", p->timeTotal, p->timeTotal );
    }

    Lpk_ManStop( p );
    // check the resulting network
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Lpk_Resynthesize: The network check has failed.\n" );
        return 0;
    }
    return 1;
}